

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

int DataVector::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  long lVar2;
  iterator __position;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  double dVar26;
  undefined7 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  const_reference cVar35;
  undefined1 *puVar36;
  undefined7 extraout_var;
  ulong uVar37;
  ulong extraout_RAX;
  ulong *in_RCX;
  undefined1 *puVar38;
  vector<DataPoint,std::allocator<DataPoint>> *in_RDX;
  ulong uVar39;
  DataPoint *__args;
  long lVar40;
  ulong uVar41;
  vector<bool,_std::allocator<bool>_> *in_R8;
  ulong *in_R9;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  int iVar66;
  int iVar67;
  undefined1 auVar64 [16];
  int iVar68;
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar82;
  int iVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  
  auVar34 = _DAT_0023b0a0;
  auVar33 = _DAT_0023b090;
  auVar32 = _DAT_0023b080;
  auVar31 = _DAT_0023b070;
  auVar30 = _DAT_0023b060;
  auVar29 = _DAT_0023b050;
  auVar28 = _DAT_0023b040;
  puVar36 = *(undefined1 **)in_RDX;
  if (puVar36 != *(undefined1 **)(in_RDX + 8)) {
    puVar38 = *(undefined1 **)(in_RDX + 8) + (-0x10 - (long)puVar36);
    auVar64._8_4_ = (int)puVar38;
    auVar64._0_8_ = puVar38;
    auVar64._12_4_ = (int)((ulong)puVar38 >> 0x20);
    auVar43._0_8_ = (ulong)puVar38 >> 4;
    auVar43._8_8_ = auVar64._8_8_ >> 4;
    puVar36 = puVar36 + 0xf0;
    uVar39 = 0;
    do {
      auVar61._8_4_ = (int)uVar39;
      auVar61._0_8_ = uVar39;
      auVar61._12_4_ = (int)(uVar39 >> 0x20);
      auVar64 = auVar43 ^ auVar34;
      auVar69 = (auVar61 | auVar33) ^ auVar34;
      iVar63 = auVar64._0_4_;
      iVar82 = -(uint)(iVar63 < auVar69._0_4_);
      iVar66 = auVar64._4_4_;
      auVar71._4_4_ = -(uint)(iVar66 < auVar69._4_4_);
      iVar67 = auVar64._8_4_;
      iVar86 = -(uint)(iVar67 < auVar69._8_4_);
      iVar68 = auVar64._12_4_;
      auVar71._12_4_ = -(uint)(iVar68 < auVar69._12_4_);
      auVar44._4_4_ = iVar82;
      auVar44._0_4_ = iVar82;
      auVar44._8_4_ = iVar86;
      auVar44._12_4_ = iVar86;
      auVar64 = pshuflw(in_XMM1,auVar44,0xe8);
      auVar70._4_4_ = -(uint)(auVar69._4_4_ == iVar66);
      auVar70._12_4_ = -(uint)(auVar69._12_4_ == iVar68);
      auVar70._0_4_ = auVar70._4_4_;
      auVar70._8_4_ = auVar70._12_4_;
      auVar53 = pshuflw(in_XMM2,auVar70,0xe8);
      auVar71._0_4_ = auVar71._4_4_;
      auVar71._8_4_ = auVar71._12_4_;
      auVar44 = pshuflw(auVar64,auVar71,0xe8);
      auVar69._8_4_ = 0xffffffff;
      auVar69._0_8_ = 0xffffffffffffffff;
      auVar69._12_4_ = 0xffffffff;
      auVar69 = (auVar44 | auVar53 & auVar64) ^ auVar69;
      auVar64 = packssdw(auVar69,auVar69);
      if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar36[-0xf0] = 0;
      }
      auVar12._4_4_ = iVar82;
      auVar12._0_4_ = iVar82;
      auVar12._8_4_ = iVar86;
      auVar12._12_4_ = iVar86;
      auVar71 = auVar70 & auVar12 | auVar71;
      auVar64 = packssdw(auVar71,auVar71);
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 ^ auVar53,auVar64 ^ auVar53);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._0_4_ >> 8 & 1) != 0) {
        puVar36[-0xe0] = 0;
      }
      auVar64 = (auVar61 | auVar32) ^ auVar34;
      auVar54._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar54._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar54._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
      auVar54._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
      auVar72._4_4_ = auVar54._0_4_;
      auVar72._0_4_ = auVar54._0_4_;
      auVar72._8_4_ = auVar54._8_4_;
      auVar72._12_4_ = auVar54._8_4_;
      iVar82 = -(uint)(auVar64._4_4_ == iVar66);
      iVar86 = -(uint)(auVar64._12_4_ == iVar68);
      auVar13._4_4_ = iVar82;
      auVar13._0_4_ = iVar82;
      auVar13._8_4_ = iVar86;
      auVar13._12_4_ = iVar86;
      auVar83._4_4_ = auVar54._4_4_;
      auVar83._0_4_ = auVar54._4_4_;
      auVar83._8_4_ = auVar54._12_4_;
      auVar83._12_4_ = auVar54._12_4_;
      auVar64 = auVar13 & auVar72 | auVar83;
      auVar64 = packssdw(auVar64,auVar64);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 ^ auVar3,auVar64 ^ auVar3);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._0_4_ >> 0x10 & 1) != 0) {
        puVar36[-0xd0] = 0;
      }
      auVar64 = pshufhw(auVar64,auVar72,0x84);
      auVar14._4_4_ = iVar82;
      auVar14._0_4_ = iVar82;
      auVar14._8_4_ = iVar86;
      auVar14._12_4_ = iVar86;
      auVar44 = pshufhw(auVar54,auVar14,0x84);
      auVar69 = pshufhw(auVar64,auVar83,0x84);
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      auVar45 = (auVar69 | auVar44 & auVar64) ^ auVar45;
      auVar64 = packssdw(auVar45,auVar45);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._0_4_ >> 0x18 & 1) != 0) {
        puVar36[-0xc0] = 0;
      }
      auVar64 = (auVar61 | auVar31) ^ auVar34;
      auVar55._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar55._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar55._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
      auVar55._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
      auVar15._4_4_ = auVar55._0_4_;
      auVar15._0_4_ = auVar55._0_4_;
      auVar15._8_4_ = auVar55._8_4_;
      auVar15._12_4_ = auVar55._8_4_;
      auVar44 = pshuflw(auVar83,auVar15,0xe8);
      auVar46._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
      auVar46._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
      auVar46._8_4_ = -(uint)(auVar64._8_4_ == iVar67);
      auVar46._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
      auVar73._4_4_ = auVar46._4_4_;
      auVar73._0_4_ = auVar46._4_4_;
      auVar73._8_4_ = auVar46._12_4_;
      auVar73._12_4_ = auVar46._12_4_;
      auVar64 = pshuflw(auVar46,auVar73,0xe8);
      auVar74._4_4_ = auVar55._4_4_;
      auVar74._0_4_ = auVar55._4_4_;
      auVar74._8_4_ = auVar55._12_4_;
      auVar74._12_4_ = auVar55._12_4_;
      auVar69 = pshuflw(auVar55,auVar74,0xe8);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 & auVar44,(auVar69 | auVar64 & auVar44) ^ auVar4);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar36[-0xb0] = 0;
      }
      auVar16._4_4_ = auVar55._0_4_;
      auVar16._0_4_ = auVar55._0_4_;
      auVar16._8_4_ = auVar55._8_4_;
      auVar16._12_4_ = auVar55._8_4_;
      auVar74 = auVar73 & auVar16 | auVar74;
      auVar69 = packssdw(auVar74,auVar74);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64,auVar69 ^ auVar5);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._4_2_ >> 8 & 1) != 0) {
        puVar36[-0xa0] = 0;
      }
      auVar64 = (auVar61 | auVar30) ^ auVar34;
      auVar56._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar56._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar56._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
      auVar56._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
      auVar75._4_4_ = auVar56._0_4_;
      auVar75._0_4_ = auVar56._0_4_;
      auVar75._8_4_ = auVar56._8_4_;
      auVar75._12_4_ = auVar56._8_4_;
      iVar82 = -(uint)(auVar64._4_4_ == iVar66);
      iVar86 = -(uint)(auVar64._12_4_ == iVar68);
      auVar17._4_4_ = iVar82;
      auVar17._0_4_ = iVar82;
      auVar17._8_4_ = iVar86;
      auVar17._12_4_ = iVar86;
      auVar84._4_4_ = auVar56._4_4_;
      auVar84._0_4_ = auVar56._4_4_;
      auVar84._8_4_ = auVar56._12_4_;
      auVar84._12_4_ = auVar56._12_4_;
      auVar64 = auVar17 & auVar75 | auVar84;
      auVar64 = packssdw(auVar64,auVar64);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 ^ auVar6,auVar64 ^ auVar6);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar36[-0x90] = 0;
      }
      auVar64 = pshufhw(auVar64,auVar75,0x84);
      auVar18._4_4_ = iVar82;
      auVar18._0_4_ = iVar82;
      auVar18._8_4_ = iVar86;
      auVar18._12_4_ = iVar86;
      auVar44 = pshufhw(auVar56,auVar18,0x84);
      auVar69 = pshufhw(auVar64,auVar84,0x84);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar47 = (auVar69 | auVar44 & auVar64) ^ auVar47;
      auVar64 = packssdw(auVar47,auVar47);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._6_2_ >> 8 & 1) != 0) {
        puVar36[-0x80] = 0;
      }
      auVar64 = (auVar61 | auVar29) ^ auVar34;
      auVar57._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar57._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar57._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
      auVar57._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
      auVar19._4_4_ = auVar57._0_4_;
      auVar19._0_4_ = auVar57._0_4_;
      auVar19._8_4_ = auVar57._8_4_;
      auVar19._12_4_ = auVar57._8_4_;
      auVar44 = pshuflw(auVar84,auVar19,0xe8);
      auVar48._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
      auVar48._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
      auVar48._8_4_ = -(uint)(auVar64._8_4_ == iVar67);
      auVar48._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
      auVar76._4_4_ = auVar48._4_4_;
      auVar76._0_4_ = auVar48._4_4_;
      auVar76._8_4_ = auVar48._12_4_;
      auVar76._12_4_ = auVar48._12_4_;
      auVar64 = pshuflw(auVar48,auVar76,0xe8);
      auVar77._4_4_ = auVar57._4_4_;
      auVar77._0_4_ = auVar57._4_4_;
      auVar77._8_4_ = auVar57._12_4_;
      auVar77._12_4_ = auVar57._12_4_;
      auVar69 = pshuflw(auVar57,auVar77,0xe8);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar58 = (auVar69 | auVar64 & auVar44) ^ auVar58;
      auVar69 = packssdw(auVar58,auVar58);
      auVar64 = packsswb(auVar64 & auVar44,auVar69);
      if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar36[-0x70] = 0;
      }
      auVar20._4_4_ = auVar57._0_4_;
      auVar20._0_4_ = auVar57._0_4_;
      auVar20._8_4_ = auVar57._8_4_;
      auVar20._12_4_ = auVar57._8_4_;
      auVar77 = auVar76 & auVar20 | auVar77;
      auVar69 = packssdw(auVar77,auVar77);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar69 = packssdw(auVar69 ^ auVar7,auVar69 ^ auVar7);
      auVar64 = packsswb(auVar64,auVar69);
      if ((auVar64._8_2_ >> 8 & 1) != 0) {
        puVar36[-0x60] = 0;
      }
      auVar64 = (auVar61 | auVar28) ^ auVar34;
      auVar59._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar59._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar59._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
      auVar59._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
      auVar78._4_4_ = auVar59._0_4_;
      auVar78._0_4_ = auVar59._0_4_;
      auVar78._8_4_ = auVar59._8_4_;
      auVar78._12_4_ = auVar59._8_4_;
      iVar82 = -(uint)(auVar64._4_4_ == iVar66);
      iVar86 = -(uint)(auVar64._12_4_ == iVar68);
      auVar21._4_4_ = iVar82;
      auVar21._0_4_ = iVar82;
      auVar21._8_4_ = iVar86;
      auVar21._12_4_ = iVar86;
      auVar85._4_4_ = auVar59._4_4_;
      auVar85._0_4_ = auVar59._4_4_;
      auVar85._8_4_ = auVar59._12_4_;
      auVar85._12_4_ = auVar59._12_4_;
      auVar64 = auVar21 & auVar78 | auVar85;
      auVar64 = packssdw(auVar64,auVar64);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 ^ auVar8,auVar64 ^ auVar8);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        puVar36[-0x50] = 0;
      }
      auVar64 = pshufhw(auVar64,auVar78,0x84);
      auVar22._4_4_ = iVar82;
      auVar22._0_4_ = iVar82;
      auVar22._8_4_ = iVar86;
      auVar22._12_4_ = iVar86;
      auVar44 = pshufhw(auVar59,auVar22,0x84);
      auVar69 = pshufhw(auVar64,auVar85,0x84);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar69 | auVar44 & auVar64) ^ auVar49;
      auVar64 = packssdw(auVar49,auVar49);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._10_2_ >> 8 & 1) != 0) {
        puVar36[-0x40] = 0;
      }
      auVar64 = (auVar61 | _DAT_0023b030) ^ auVar34;
      auVar60._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar60._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar60._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
      auVar60._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
      auVar23._4_4_ = auVar60._0_4_;
      auVar23._0_4_ = auVar60._0_4_;
      auVar23._8_4_ = auVar60._8_4_;
      auVar23._12_4_ = auVar60._8_4_;
      auVar44 = pshuflw(auVar85,auVar23,0xe8);
      auVar50._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
      auVar50._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
      auVar50._8_4_ = -(uint)(auVar64._8_4_ == iVar67);
      auVar50._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
      auVar79._4_4_ = auVar50._4_4_;
      auVar79._0_4_ = auVar50._4_4_;
      auVar79._8_4_ = auVar50._12_4_;
      auVar79._12_4_ = auVar50._12_4_;
      auVar64 = pshuflw(auVar50,auVar79,0xe8);
      auVar80._4_4_ = auVar60._4_4_;
      auVar80._0_4_ = auVar60._4_4_;
      auVar80._8_4_ = auVar60._12_4_;
      auVar80._12_4_ = auVar60._12_4_;
      auVar69 = pshuflw(auVar60,auVar80,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 & auVar44,(auVar69 | auVar64 & auVar44) ^ auVar9);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar36[-0x30] = 0;
      }
      auVar24._4_4_ = auVar60._0_4_;
      auVar24._0_4_ = auVar60._0_4_;
      auVar24._8_4_ = auVar60._8_4_;
      auVar24._12_4_ = auVar60._8_4_;
      auVar80 = auVar79 & auVar24 | auVar80;
      auVar69 = packssdw(auVar80,auVar80);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64,auVar69 ^ auVar10);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._12_2_ >> 8 & 1) != 0) {
        puVar36[-0x20] = 0;
      }
      auVar64 = (auVar61 | _DAT_0023b020) ^ auVar34;
      auVar51._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar51._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar51._8_4_ = -(uint)(iVar67 < auVar64._8_4_);
      auVar51._12_4_ = -(uint)(iVar68 < auVar64._12_4_);
      auVar81._4_4_ = auVar51._0_4_;
      auVar81._0_4_ = auVar51._0_4_;
      auVar81._8_4_ = auVar51._8_4_;
      auVar81._12_4_ = auVar51._8_4_;
      auVar62._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
      auVar62._12_4_ = -(uint)(auVar64._12_4_ == iVar68);
      auVar62._0_4_ = auVar62._4_4_;
      auVar62._8_4_ = auVar62._12_4_;
      auVar65._4_4_ = auVar51._4_4_;
      auVar65._0_4_ = auVar51._4_4_;
      auVar65._8_4_ = auVar51._12_4_;
      auVar65._12_4_ = auVar51._12_4_;
      auVar69 = auVar62 & auVar81 | auVar65;
      auVar64 = packssdw(auVar51,auVar69);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 ^ auVar11,auVar64 ^ auVar11);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar36[-0x10] = 0;
      }
      auVar64 = pshufhw(auVar64,auVar81,0x84);
      auVar69 = pshufhw(auVar69,auVar62,0x84);
      in_XMM2 = auVar69 & auVar64;
      auVar64 = pshufhw(auVar64,auVar65,0x84);
      auVar52._8_4_ = 0xffffffff;
      auVar52._0_8_ = 0xffffffffffffffff;
      auVar52._12_4_ = 0xffffffff;
      auVar52 = (auVar64 | in_XMM2) ^ auVar52;
      auVar64 = packssdw(auVar52,auVar52);
      in_XMM1 = packsswb(auVar64,auVar64);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *puVar36 = 0;
      }
      uVar39 = uVar39 + 0x10;
      puVar36 = puVar36 + 0x100;
    } while ((((ulong)puVar38 >> 4) + 0x10 & 0xfffffffffffffff0) != uVar39);
  }
  iVar63 = (int)puVar36;
  if (*(long *)src != 0) {
    lVar40 = 0;
    uVar39 = 0;
    uVar42 = 0;
    do {
      if (uVar39 < *in_R9) {
        cVar35 = std::vector<bool,_std::allocator<bool>_>::at(in_R8,uVar39);
        iVar63 = (int)CONCAT71(extraout_var,cVar35);
        if (cVar35) goto LAB_00187277;
      }
      else {
LAB_00187277:
        lVar2 = *(long *)dst;
        uVar37 = *(long *)(dst + 8) - lVar2 >> 4;
        uVar41 = uVar39;
        if (uVar42 < *in_RCX) {
          if (uVar37 <= uVar39) {
LAB_00187322:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar41,uVar37);
          }
          uVar37 = *(long *)(in_RDX + 8) - *(long *)in_RDX >> 4;
          uVar41 = uVar42;
          if (uVar37 <= uVar42) goto LAB_00187322;
          uVar37 = uVar42 * 0x10;
          uVar25 = ((undefined8 *)(lVar2 + lVar40))[1];
          puVar1 = (undefined8 *)(*(long *)in_RDX + uVar37);
          *puVar1 = *(undefined8 *)(lVar2 + lVar40);
          puVar1[1] = uVar25;
        }
        else {
          if (uVar37 <= uVar39) goto LAB_00187322;
          __args = (DataPoint *)(lVar2 + lVar40);
          __position._M_current = *(DataPoint **)(in_RDX + 8);
          if (__position._M_current == *(DataPoint **)(in_RDX + 0x10)) {
            std::vector<DataPoint,std::allocator<DataPoint>>::_M_realloc_insert<DataPoint_const&>
                      (in_RDX,__position,__args);
            uVar37 = extraout_RAX;
          }
          else {
            uVar27 = *(undefined7 *)&__args->field_0x1;
            dVar26 = __args->value;
            (__position._M_current)->active = __args->active;
            *(undefined7 *)&(__position._M_current)->field_0x1 = uVar27;
            (__position._M_current)->value = dVar26;
            *(long *)(in_RDX + 8) = *(long *)(in_RDX + 8) + 0x10;
          }
        }
        iVar63 = (int)uVar37;
        uVar42 = uVar42 + 1;
      }
      uVar39 = uVar39 + 1;
      lVar40 = lVar40 + 0x10;
    } while (uVar39 < *(ulong *)src);
  }
  return iVar63;
}

Assistant:

static
    void copy(DataVector const & src,
              DataVector::size_type const & numSrc,
              DataVector & dst,
              DataVector::size_type const & numDst,
              std::vector<bool> const & mask,
              DataVector::size_type const & numMask)
    {

        // Deactivate all destination value by default
        dst.deactivate();

        // Copy elements
        DataVector::size_type j = 0;
        for (DataVector::size_type i = 0; i < numSrc; i++)
        {
            // Check if current value is masked out
            if (i < numMask)
            {
                if (!mask.at(i)) continue;
            }

            // Add or set next value
            if (j >= numDst)
            {
                dst.push_back(src.at(i));
            }
            else
            {
                dst.at(j) = src.at(i);
            }
            j++;
        }

    }